

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glist.c
# Opt level: O2

gnode_t * glist_insert_ptr(gnode_t *gn,void *ptr)

{
  gnode_t *pgVar1;
  
  pgVar1 = (gnode_t *)
           __ckd_calloc__(1,0x10,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/glist.c"
                          ,0xbf);
  (pgVar1->data).ptr = ptr;
  pgVar1->next = gn->next;
  gn->next = pgVar1;
  return pgVar1;
}

Assistant:

gnode_t *
glist_insert_ptr(gnode_t * gn, void *ptr)
{
    gnode_t *newgn;

    newgn = (gnode_t *) ckd_calloc(1, sizeof(gnode_t));
    newgn->data.ptr = ptr;
    newgn->next = gn->next;
    gn->next = newgn;

    return newgn;
}